

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  __type _Var1;
  bool bVar2;
  long in_RDI;
  string les;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  long local_158;
  uint local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8 [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [2];
  byte local_1;
  
  ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  if ((*(byte *)(in_RDI + 0x2d9) & 1) != 0) {
    ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    CLI::detail::remove_underscore(in_stack_fffffffffffffe28);
    in_stack_fffffffffffffde0 = local_58;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    CLI::detail::remove_underscore(in_stack_fffffffffffffe28);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  }
  if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
    ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    CLI::detail::to_lower(in_stack_fffffffffffffe18);
    in_stack_fffffffffffffdd8 = local_e8;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    CLI::detail::to_lower(in_stack_fffffffffffffe18);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  }
  _Var1 = ::std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  if (_Var1) {
    local_1 = 1;
    local_14c = 1;
  }
  else {
    local_158 = in_RDI + 0x330;
    local_160._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(in_stack_fffffffffffffdd8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end(in_stack_fffffffffffffdd8);
    while (bVar2 = __gnu_cxx::
                   operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffde0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffdd8), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_160);
      ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      if ((*(byte *)(in_RDI + 0x2d9) & 1) != 0) {
        ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        CLI::detail::remove_underscore(in_stack_fffffffffffffe28);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
      }
      if ((*(byte *)(in_RDI + 0x2d8) & 1) != 0) {
        ::std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
        CLI::detail::to_lower(in_stack_fffffffffffffe18);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
      }
      _Var1 = ::std::operator==(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      if (_Var1) {
        local_1 = 1;
      }
      local_14c = (uint)_Var1;
      ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
      if (local_14c != 0) goto LAB_001bee22;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_160);
    }
    local_1 = 0;
    local_14c = 1;
  }
LAB_001bee22:
  ::std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  return (bool)(local_1 & 1);
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}